

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O2

size_t __thiscall
llama_context::state_seq_save_file
          (llama_context *this,llama_seq_id seq_id,char *filepath,llama_token *tokens,
          size_t n_token_count)

{
  size_t sVar1;
  llama_file file;
  llama_io_write_file io;
  
  llama_file::llama_file(&file,filepath,"wb");
  llama_file::write_u32(&file,0x67677371);
  llama_file::write_u32(&file,2);
  llama_file::write_u32(&file,(uint32_t)n_token_count);
  llama_file::write_raw(&file,tokens,n_token_count * 4);
  io.super_llama_io_write_i._vptr_llama_io_write_i =
       (_func_int **)&PTR__llama_io_write_file_002cd5e0;
  io.size_written = 0;
  io.temp_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  io.temp_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  io.temp_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  io.file = &file;
  state_seq_write_data(this,&io.super_llama_io_write_i,seq_id);
  sVar1 = llama_file::tell(&file);
  if (sVar1 == io.size_written + n_token_count * 4 + 0xc) {
    llama_io_write_file::~llama_io_write_file(&io);
    llama_file::~llama_file(&file);
    return sVar1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
             ,0x7df,"GGML_ASSERT(%s) failed",
             "res == sizeof(uint32_t) * 3 + sizeof(llama_token) * n_token_count + io.n_bytes()");
}

Assistant:

size_t llama_context::state_seq_save_file(llama_seq_id seq_id, const char * filepath, const llama_token * tokens, size_t n_token_count) {
    llama_file file(filepath, "wb");

    file.write_u32(LLAMA_STATE_SEQ_MAGIC);
    file.write_u32(LLAMA_STATE_SEQ_VERSION);

    // save the prompt
    file.write_u32((uint32_t) n_token_count);
    file.write_raw(tokens, sizeof(llama_token) * n_token_count);

    // save the context state using stream saving
    llama_io_write_file io(&file);
    state_seq_write_data(io, seq_id);

    const size_t res = file.tell();
    GGML_ASSERT(res == sizeof(uint32_t) * 3 + sizeof(llama_token) * n_token_count + io.n_bytes());

    return res;
}